

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZone::getCanonicalID
          (UnicodeString *id,UnicodeString *canonicalID,UBool *isSystemID,UErrorCode *status)

{
  UnicodeString *this;
  UBool UVar1;
  int8_t iVar2;
  ConstChar16Ptr local_38;
  UErrorCode *local_30;
  UErrorCode *status_local;
  UBool *isSystemID_local;
  UnicodeString *canonicalID_local;
  UnicodeString *id_local;
  
  local_30 = status;
  status_local = (UErrorCode *)isSystemID;
  isSystemID_local = (UBool *)canonicalID;
  canonicalID_local = id;
  UnicodeString::remove(canonicalID,(char *)canonicalID);
  *(undefined1 *)status_local = U_ZERO_ERROR;
  UVar1 = ::U_FAILURE(*local_30);
  this = canonicalID_local;
  if (UVar1 == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_38,L"Etc/Unknown");
    iVar2 = UnicodeString::compare(this,&local_38,0xb);
    ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    if (iVar2 == '\0') {
      UnicodeString::fastCopyFrom((UnicodeString *)isSystemID_local,canonicalID_local);
      *(undefined1 *)status_local = U_ZERO_ERROR;
    }
    else {
      ZoneMeta::getCanonicalCLDRID(canonicalID_local,(UnicodeString *)isSystemID_local,local_30);
      UVar1 = ::U_SUCCESS(*local_30);
      if (UVar1 == '\0') {
        *local_30 = U_ZERO_ERROR;
        getCustomID(canonicalID_local,(UnicodeString *)isSystemID_local,local_30);
      }
      else {
        *(undefined1 *)status_local = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
    id_local = (UnicodeString *)isSystemID_local;
  }
  else {
    id_local = (UnicodeString *)isSystemID_local;
  }
  return id_local;
}

Assistant:

UnicodeString&
TimeZone::getCanonicalID(const UnicodeString& id, UnicodeString& canonicalID, UBool& isSystemID,
                         UErrorCode& status)
{
    canonicalID.remove();
    isSystemID = FALSE;
    if (U_FAILURE(status)) {
        return canonicalID;
    }
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) == 0) {
        // special case - Etc/Unknown is a canonical ID, but not system ID
        canonicalID.fastCopyFrom(id);
        isSystemID = FALSE;
    } else {
        ZoneMeta::getCanonicalCLDRID(id, canonicalID, status);
        if (U_SUCCESS(status)) {
            isSystemID = TRUE;
        } else {
            // Not a system ID
            status = U_ZERO_ERROR;
            getCustomID(id, canonicalID, status);
        }
    }
    return canonicalID;
}